

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_constraints_unittest.cc
# Opt level: O2

void __thiscall
bssl::ParseNameConstraints_FailsOnEmptyPermitted_Test::
~ParseNameConstraints_FailsOnEmptyPermitted_Test
          (ParseNameConstraints_FailsOnEmptyPermitted_Test *this)

{
  ~ParseNameConstraints_FailsOnEmptyPermitted_Test
            ((ParseNameConstraints_FailsOnEmptyPermitted_Test *)
             &this[-1].super_ParseNameConstraints.super_TestWithParam<std::tuple<bool>_>.super_Test.
              gtest_flag_saver_);
  return;
}

Assistant:

TEST_P(ParseNameConstraints, FailsOnEmptyPermitted) {
  std::string constraints_der;
  ASSERT_TRUE(LoadTestNameConstraint("invalid-empty_permitted_subtree.pem",
                                     &constraints_der));
  CertErrors errors;
  EXPECT_FALSE(NameConstraints::Create(StringAsBytes(constraints_der),
                                       is_critical(), &errors));
}